

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

void __thiscall Fl_Widget::draw_focus(Fl_Widget *this,Fl_Boxtype B,int X,int Y,int W,int H)

{
  int iVar1;
  Fl_Color FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Boxtype B_local;
  Fl_Widget *this_local;
  
  iVar1 = Fl::visible_focus();
  if (iVar1 != 0) {
    if ((((B == FL_DOWN_BOX) || (B == FL_DOWN_FRAME)) || (B == FL_THIN_DOWN_BOX)) ||
       (H_local = Y, W_local = X, B == FL_THIN_DOWN_FRAME)) {
      W_local = X + 1;
      H_local = Y + 1;
    }
    FVar2 = color(this);
    FVar2 = fl_contrast(0x38,FVar2);
    fl_color(FVar2);
    fl_line_style(2,0,(char *)0x0);
    iVar1 = Fl::box_dx(B);
    iVar3 = Fl::box_dy(B);
    iVar4 = Fl::box_dw(B);
    iVar5 = Fl::box_dh(B);
    fl_rect(W_local + iVar1,H_local + iVar3,(W - iVar4) + -1,(H - iVar5) + -1);
    fl_line_style(0,0,(char *)0x0);
  }
  return;
}

Assistant:

void
Fl_Widget::draw_focus(Fl_Boxtype B, int X, int Y, int W, int H) const {
  if (!Fl::visible_focus()) return;
  switch (B) {
    case FL_DOWN_BOX:
    case FL_DOWN_FRAME:
    case FL_THIN_DOWN_BOX:
    case FL_THIN_DOWN_FRAME:
      X ++;
      Y ++;
    default:
      break;
  }

  fl_color(fl_contrast(FL_BLACK, color()));

#if defined(USE_X11) || defined(__APPLE_QUARTZ__)
  fl_line_style(FL_DOT);
  fl_rect(X + Fl::box_dx(B), Y + Fl::box_dy(B),
          W - Fl::box_dw(B) - 1, H - Fl::box_dh(B) - 1);
  fl_line_style(FL_SOLID);
#elif defined(WIN32) 
  // Windows 95/98/ME do not implement the dotted line style, so draw
  // every other pixel around the focus area...
  //
  // Also, QuickDraw (MacOS) does not support line styles specifically,
  // and the hack we use in fl_line_style() will not draw horizontal lines
  // on odd-numbered rows...
  int i, xx, yy;

  X += Fl::box_dx(B);
  Y += Fl::box_dy(B);
  W -= Fl::box_dw(B) + 2;
  H -= Fl::box_dh(B) + 2;

  for (xx = 0, i = 1; xx < W; xx ++, i ++) if (i & 1) fl_point(X + xx, Y);
  for (yy = 0; yy < H; yy ++, i ++) if (i & 1) fl_point(X + W, Y + yy);
  for (xx = W; xx > 0; xx --, i ++) if (i & 1) fl_point(X + xx, Y + H);
  for (yy = H; yy > 0; yy --, i ++) if (i & 1) fl_point(X, Y + yy);
#else
# error unsupported platform
#endif // WIN32
}